

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

Schema __thiscall capnp::SchemaLoader::getUnbound(SchemaLoader *this,uint64_t id)

{
  Reader brand;
  undefined1 auVar1 [40];
  Schema SVar2;
  RawBrandedSchema *pRVar3;
  
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  SVar2 = get(this,id,brand,(Schema)0x27f800);
  kj::_::Mutex::lock((Mutex *)this,0);
  pRVar3 = Impl::getUnbound((this->impl).value.ptr,(SVar2.raw)->generic);
  kj::_::Mutex::unlock((Mutex *)this,EXCLUSIVE,(Waiter *)0x0);
  return (Schema)pRVar3;
}

Assistant:

Schema SchemaLoader::getUnbound(uint64_t id) const {
  auto schema = get(id);
  return Schema(impl.lockExclusive()->get()->getUnbound(schema.raw->generic));
}